

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O2

void __thiscall
t_rb_generator::generate_field_defns(t_rb_generator *this,t_rb_ofstream *out,t_struct *tstruct)

{
  undefined1 *puVar1;
  t_field *ptVar2;
  t_rb_ofstream *ptVar3;
  ostream *poVar4;
  pointer pptVar5;
  string local_70;
  string local_50;
  
  ptVar3 = t_rb_ofstream::indent(out);
  poVar4 = std::operator<<((ostream *)ptVar3,"FIELDS = {");
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  puVar1 = &(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
  *(int *)puVar1 = *(int *)puVar1 + 1;
  for (pptVar5 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pptVar5 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
    if (pptVar5 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      poVar4 = std::operator<<((ostream *)out,",");
      std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
    }
    generate_rdoc(this,out,&(*pptVar5)->super_t_doc);
    ptVar3 = t_rb_ofstream::indent(out);
    std::__cxx11::string::string((string *)&local_70,(string *)&(*pptVar5)->name_);
    t_oop_generator::upcase_string(&local_50,&this->super_t_oop_generator,&local_70);
    poVar4 = std::operator<<((ostream *)ptVar3,(string *)&local_50);
    std::operator<<(poVar4," => ");
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    ptVar2 = *pptVar5;
    generate_field_data(this,out,ptVar2->type_,&ptVar2->name_,ptVar2->value_,
                        ptVar2->req_ == T_OPTIONAL);
  }
  puVar1 = &(out->super_ofstream).super_basic_ostream<char,_std::char_traits<char>_>.field_0xf8;
  *(int *)puVar1 = *(int *)puVar1 + -1;
  std::operator<<((ostream *)out,(string *)&::endl_abi_cxx11_);
  ptVar3 = t_rb_ofstream::indent(out);
  poVar4 = std::operator<<((ostream *)ptVar3,"}");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  ptVar3 = t_rb_ofstream::indent(out);
  poVar4 = std::operator<<((ostream *)ptVar3,"def struct_fields; FIELDS; end");
  poVar4 = std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar4,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_rb_generator::generate_field_defns(t_rb_ofstream& out, t_struct* tstruct) {
  const vector<t_field*>& fields = tstruct->get_members();
  vector<t_field*>::const_iterator f_iter;

  out.indent() << "FIELDS = {" << endl;
  out.indent_up();
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (f_iter != fields.begin()) {
      out << "," << endl;
    }

    // generate the field docstrings within the FIELDS constant. no real better place...
    generate_rdoc(out, *f_iter);

    out.indent() << upcase_string((*f_iter)->get_name()) << " => ";

    generate_field_data(out,
                        (*f_iter)->get_type(),
                        (*f_iter)->get_name(),
                        (*f_iter)->get_value(),
                        (*f_iter)->get_req() == t_field::T_OPTIONAL);
  }
  out.indent_down();
  out << endl;
  out.indent() << "}" << endl << endl;

  out.indent() << "def struct_fields; FIELDS; end" << endl << endl;
}